

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opener_file_system.cpp
# Opt level: O3

void __thiscall
duckdb::OpenerFileSystem::VerifyCanAccessFileInternal
          (OpenerFileSystem *this,string *path,FileType type)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PermissionException *this_00;
  char *params;
  optional_ptr<duckdb::DatabaseInstance,_true> db;
  optional_ptr<duckdb::FileOpener,_true> opener;
  optional_ptr<duckdb::DatabaseInstance,_true> local_78;
  optional_ptr<duckdb::FileOpener,_true> local_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar3 = (*(this->super_FileSystem)._vptr_FileSystem[0x2c])();
  local_70.ptr = (FileOpener *)CONCAT44(extraout_var,iVar3);
  if (local_70.ptr != (FileOpener *)0x0) {
    optional_ptr<duckdb::FileOpener,_true>::CheckValid(&local_70);
    iVar3 = (*(local_70.ptr)->_vptr_FileOpener[5])();
    local_78.ptr = (DatabaseInstance *)CONCAT44(extraout_var_00,iVar3);
    if (local_78.ptr != (DatabaseInstance *)0x0) {
      optional_ptr<duckdb::DatabaseInstance,_true>::CheckValid(&local_78);
      bVar2 = DBConfig::CanAccessFile(&(local_78.ptr)->config,path,type);
      if (!bVar2) {
        this_00 = (PermissionException *)__cxa_allocate_exception(0x10);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,
                   "Cannot access %s \"%s\" - file system operations are disabled by configuration",
                   "");
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        pcVar1 = (path->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_48,pcVar1,pcVar1 + path->_M_string_length);
        params = "file";
        if (type == FILE_TYPE_DIR) {
          params = "directory";
        }
        PermissionException::PermissionException<char_const*,std::__cxx11::string>
                  (this_00,&local_68,params,&local_48);
        __cxa_throw(this_00,&PermissionException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  return;
}

Assistant:

void OpenerFileSystem::VerifyCanAccessFileInternal(const string &path, FileType type) {
	auto opener = GetOpener();
	if (!opener) {
		return;
	}
	auto db = opener->TryGetDatabase();
	if (!db) {
		return;
	}
	auto &config = db->config;
	if (!config.CanAccessFile(path, type)) {
		throw PermissionException("Cannot access %s \"%s\" - file system operations are disabled by configuration",
		                          type == FileType::FILE_TYPE_DIR ? "directory" : "file", path);
	}
}